

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::
OP_LdSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  Var pvVar1;
  
  pvVar1 = OP_LdSlot(this,instance,
                     (uint)(playout->
                           super_OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           SlotIndex);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::OP_LdSlot(Var instance, const unaligned T* playout)
    {
        return OP_LdSlot(instance, playout->SlotIndex);
    }